

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O3

void __thiscall
kaitai::validation_not_equal_error<intel_acbp_v2_t::structure_ids_t>::validation_not_equal_error
          (validation_not_equal_error<intel_acbp_v2_t::structure_ids_t> *this,
          structure_ids_t *expected,structure_ids_t *actual,kstream *io,string *src_path)

{
  pointer pcVar1;
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"not equal","");
  pcVar1 = (src_path->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + src_path->_M_string_length);
  validation_failed_error::validation_failed_error
            (&this->super_validation_failed_error,&local_70,io,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)&(this->super_validation_failed_error).super_kstruct_error =
       &PTR__kstruct_error_002b2750;
  this->m_expected = expected;
  this->m_actual = actual;
  return;
}

Assistant:

validation_not_equal_error<T>(const T& expected, const T& actual, kstream* io, const std::string src_path):
        validation_failed_error("not equal", io, src_path),
        m_expected(expected),
        m_actual(actual)
    {
    }